

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autodumper.cpp
# Opt level: O3

void autoDump(string *pathIn,string *baseNamePathOut,CRC32Lookup *crc,bool recursive,bool autoConv)

{
  pointer pcVar1;
  CRC32Lookup crc_00;
  string *psVar2;
  bool bVar3;
  int iVar4;
  ZounaClasses type;
  dirent *pdVar5;
  size_t sVar6;
  long *plVar7;
  Parser *pPVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar9;
  undefined4 extraout_var_01;
  runtime_error *prVar10;
  size_type *psVar11;
  char *pcVar12;
  long *plVar13;
  _Alloc_hider _Var14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string totalPath;
  string newbase;
  string fileExt;
  _Alloc_hider in_stack_fffffffffffffa20;
  size_type in_stack_fffffffffffffa28;
  size_type sVar17;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  DIR *local_560;
  string local_558;
  dirent *local_538;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  long *local_430;
  long local_428;
  long local_420;
  undefined4 uStack_418;
  undefined4 uStack_414;
  string local_410;
  string local_3f0;
  string local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  string local_390;
  string local_370;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  string local_330;
  string local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  string local_2d0;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  string local_290;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_1b0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_180;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_150;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_120;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_f0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_c0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_60;
  
  pcVar1 = (pathIn->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + pathIn->_M_string_length);
  bVar3 = isADirectory(&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (bVar3) {
    local_560 = opendir((pathIn->_M_dataplus)._M_p);
    pdVar5 = readdir(local_560);
    if (pdVar5 != (dirent *)0x0) {
      do {
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        local_538 = pdVar5;
        sVar6 = strlen(pdVar5->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_580,pdVar5->d_name,local_538->d_name + sVar6);
        iVar4 = std::__cxx11::string::compare((char *)&local_580);
        if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_580), iVar4 != 0))
        {
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          pcVar1 = (pathIn->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_450,pcVar1,pcVar1 + pathIn->_M_string_length);
          trailFolder(&local_5a0,&local_450);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_5a0,(ulong)local_580._M_dataplus._M_p);
          _Var15._M_p = &stack0xfffffffffffffa30;
          if ((long *)*plVar7 != plVar7 + 2) {
            _Var15._M_p = (pointer)*plVar7;
          }
          sVar17 = plVar7[1];
          *plVar7 = (long)(plVar7 + 2);
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
            operator_delete(local_5a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p);
          }
          local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b0,_Var15._M_p,_Var15._M_p + sVar17);
          bVar3 = isADirectory(&local_4b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p);
          }
          if (bVar3 && recursive) {
            local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
            pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d0,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
            bVar3 = isADirectory(&local_4d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (!bVar3) {
              mkdir((baseNamePathOut->_M_dataplus)._M_p,0x1c0);
            }
            local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
            pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_470,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
            trailFolder(&local_558,&local_470);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_558,(ulong)local_580._M_dataplus._M_p);
            local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_5a0.field_2._M_allocated_capacity = *psVar11;
              local_5a0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_5a0.field_2._M_allocated_capacity = *psVar11;
              local_5a0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_5a0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p != &local_470.field_2) {
              operator_delete(local_470._M_dataplus._M_p);
            }
            local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4f0,local_5a0._M_dataplus._M_p,
                       local_5a0._M_dataplus._M_p + local_5a0._M_string_length);
            bVar3 = isADirectory(&local_4f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
              operator_delete(local_4f0._M_dataplus._M_p);
            }
            if ((!bVar3) && (iVar4 = mkdir(local_5a0._M_dataplus._M_p,0x1c0), iVar4 != 0)) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_210,"Couldn\'t open %s for writing!\n","");
              formatString<char_const*>(&local_558,&local_210,local_5a0._M_dataplus._M_p);
              std::runtime_error::runtime_error(prVar10,(string *)&local_558);
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,_Var15._M_p,_Var15._M_p + sVar17);
            trailFolder(&local_3d0,&local_510);
            local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_490,local_5a0._M_dataplus._M_p,
                       local_5a0._M_dataplus._M_p + local_5a0._M_string_length);
            trailFolder(&local_3f0,&local_490);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
            ::_Rb_tree(&local_60,
                       (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                        *)crc);
            autoDump(&local_3d0,&local_3f0,(CRC32Lookup *)&local_60,true,autoConv);
            CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490._M_dataplus._M_p != &local_490.field_2) {
              operator_delete(local_490._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            psVar2 = &local_5a0;
            _Var14._M_p = local_5a0._M_dataplus._M_p;
          }
          else {
            local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_530,_Var15._M_p,_Var15._M_p + sVar17);
            std::operator+(&local_230,baseNamePathOut,&local_580);
            getFileBase(&local_410,&local_230);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
            ::_Rb_tree(&local_90,
                       (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                        *)crc);
            autoDump(&local_530,&local_410,(CRC32Lookup *)&local_90,recursive,autoConv);
            CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
            }
            psVar2 = &local_530;
            _Var14._M_p = local_530._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var14._M_p != &psVar2->field_2) {
            operator_delete(_Var14._M_p);
          }
          if (_Var15._M_p != &stack0xfffffffffffffa30) {
            operator_delete(_Var15._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p);
        }
        pdVar5 = readdir(local_560);
      } while (pdVar5 != (dirent *)0x0);
    }
    closedir(local_560);
    return;
  }
  pcVar1 = (pathIn->_M_dataplus)._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + pathIn->_M_string_length);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  ::_Rb_tree(&local_f0,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
              *)crc);
  type = autoDetectFile(&local_250,(CRC32Lookup *)&local_f0);
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  ::_Rb_tree(&local_c0,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
              *)crc);
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffffa20._M_p;
  crc_00.m_map._M_t._M_impl._0_8_ = baseNamePathOut;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffa28;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffa30;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffa38;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)crc;
  pPVar8 = getMatchingParser(type,crc_00);
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_c0);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580._M_string_length = 0;
  local_580.field_2._M_local_buf[0] = '\0';
  if ((int)type < 0xa0) {
    if (type == DPC) {
      pcVar1 = (pathIn->_M_dataplus)._M_p;
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,pcVar1,pcVar1 + pathIn->_M_string_length);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
      ::_Rb_tree(&local_150,
                 (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                  *)crc);
      iVar4 = (*pPVar8->_vptr_Parser[2])(pPVar8,local_2b0,&local_150);
      plVar7 = (long *)CONCAT44(extraout_var_01,iVar4);
      CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_150);
      if (local_2b0[0] != local_2a0) {
        operator_delete(local_2b0[0]);
      }
      pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
      trailFolder((string *)&stack0xfffffffffffffa20,&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,in_stack_fffffffffffffa20._M_p,
                 in_stack_fffffffffffffa20._M_p + in_stack_fffffffffffffa28);
      (**(code **)(*plVar7 + 0x18))(plVar7,local_2f0);
      if (local_2f0[0] != local_2e0) {
        operator_delete(local_2f0[0]);
      }
      if (autoConv) {
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,in_stack_fffffffffffffa20._M_p,
                   in_stack_fffffffffffffa20._M_p + in_stack_fffffffffffffa28);
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,in_stack_fffffffffffffa20._M_p,
                   in_stack_fffffffffffffa20._M_p + in_stack_fffffffffffffa28);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
        ::_Rb_tree(&local_180,
                   (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                    *)crc);
        autoDump(&local_310,&local_330,(CRC32Lookup *)&local_180,recursive,true);
        CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
      }
      (*pPVar8->_vptr_Parser[1])(pPVar8);
      (**(code **)(*plVar7 + 0x10))(plVar7);
      if (in_stack_fffffffffffffa20._M_p != &stack0xfffffffffffffa30) {
        operator_delete(in_stack_fffffffffffffa20._M_p);
      }
      goto LAB_001067fa;
    }
    if (type != sdx) goto LAB_001067fa;
    pcVar1 = (pathIn->_M_dataplus)._M_p;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,pcVar1,pcVar1 + pathIn->_M_string_length);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
    ::_Rb_tree(&local_120,
               (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                *)crc);
    iVar4 = (*pPVar8->_vptr_Parser[2])(pPVar8,local_270,&local_120);
    plVar7 = (long *)CONCAT44(extraout_var,iVar4);
    CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_120);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    paVar16 = &local_290.field_2;
    pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
    local_290._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
    trailFolder(&local_1f0,&local_290);
    (**(code **)(*plVar7 + 0x18))(plVar7,&local_1f0);
    _Var15._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
      _Var15._M_p = local_290._M_dataplus._M_p;
    }
  }
  else {
    if (type == Bitmap_Z) {
      pcVar12 = "png";
    }
    else if (type == Mesh_Z) {
      pcVar12 = "obj";
    }
    else {
      if (type != Sound_Z) goto LAB_001067fa;
      pcVar12 = "wav";
    }
    std::__cxx11::string::_M_replace((ulong)&local_580,0,(char *)0x0,(ulong)pcVar12);
    pcVar1 = (pathIn->_M_dataplus)._M_p;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_350,pcVar1,pcVar1 + pathIn->_M_string_length);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
    ::_Rb_tree(&local_1b0,
               (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                *)crc);
    iVar4 = (*pPVar8->_vptr_Parser[2])(pPVar8,local_350,&local_1b0);
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar4);
    CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_1b0);
    if (local_350[0] != local_340) {
      operator_delete(local_350[0]);
    }
    if (plVar7 == (long *)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_370,"Couldn\'t parse %s!\n","");
      formatString<char_const*>
                ((string *)&stack0xfffffffffffffa20,&local_370,(pathIn->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar10,(string *)&stack0xfffffffffffffa20);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_390,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
    getFileExtension((string *)&stack0xfffffffffffffa20,&local_390);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&stack0xfffffffffffffa30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa20._M_p != paVar16) {
      operator_delete(in_stack_fffffffffffffa20._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if (in_stack_fffffffffffffa28 == 0) {
      pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
      _Var15._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffa20,pcVar1,
                 pcVar1 + baseNamePathOut->_M_string_length);
      std::__cxx11::string::append(&stack0xfffffffffffffa20);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 (&stack0xfffffffffffffa20,(ulong)local_580._M_dataplus._M_p);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_420 = *plVar13;
        uStack_418 = (undefined4)plVar9[3];
        uStack_414 = *(undefined4 *)((long)plVar9 + 0x1c);
        local_430 = &local_420;
      }
      else {
        local_420 = *plVar13;
        local_430 = (long *)*plVar9;
      }
      local_428 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      (**(code **)(*plVar7 + 0x18))(plVar7);
      if (local_430 != &local_420) {
        operator_delete(local_430);
      }
    }
    else {
      paVar16 = &local_3a0;
      pcVar1 = (baseNamePathOut->_M_dataplus)._M_p;
      local_3b0[0] = paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b0,pcVar1,pcVar1 + baseNamePathOut->_M_string_length);
      (**(code **)(*plVar7 + 0x18))(plVar7,local_3b0);
      _Var15._M_p = (pointer)local_3b0[0];
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var15._M_p != paVar16) {
    operator_delete(_Var15._M_p);
  }
  (*pPVar8->_vptr_Parser[1])(pPVar8);
  (**(code **)(*plVar7 + 0x10))(plVar7);
LAB_001067fa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  return;
}

Assistant:

void autoDump(std::string pathIn, std::string baseNamePathOut, CRC32Lookup crc, bool recursive, bool autoConv){
    if(isADirectory(pathIn)){
        struct dirent *entry = nullptr;
        DIR *dir = nullptr;
        dir = opendir(pathIn.c_str());
        while( (entry=readdir(dir))){
            std::string childPath = entry->d_name;
            //delete entry;
            if (childPath=="." || childPath == "..")
                continue;
            std::string totalPath = trailFolder(pathIn)+childPath;
            if(isADirectory(totalPath)&&recursive){
                if(!isADirectory(baseNamePathOut))
                    mkdir(baseNamePathOut.c_str(),S_IRWXU);
                std::string newbase= trailFolder(baseNamePathOut)+childPath;
                if (!isADirectory(newbase))
                    if ( mkdir(newbase.c_str(), 0700) != 0)
                        throw CANT_WRITE(newbase.c_str());
                autoDump(trailFolder(totalPath),trailFolder(newbase),crc,recursive,autoConv);
                continue;
            }
            autoDump(totalPath,getFileBase(baseNamePathOut+childPath),crc,recursive,autoConv);
        }
        closedir(dir);
        return;
    }
    ZounaClasses type = autoDetectFile(pathIn,crc);
    //TODO: avoid having to initialize a parser object every darn time
    Parser *parser = getMatchingParser(type,crc);

    std::string fileExt;
    switch(type){

    case ZounaClasses::Bitmap_Z:
        fileExt="png";
        break;
    case ZounaClasses::Mesh_Z:
        fileExt="obj";
        break;

    case ZounaClasses::Sound_Z:
        fileExt="wav";
        break;
    case ZounaClasses::sdx:{
        ParserResult *result = parser->parseFile(pathIn,crc);
        result->dump(trailFolder(baseNamePathOut));
        delete parser;
        delete result;
        return;
    }

    case ZounaClasses::DPC:
        try{
            ParserResult *result = parser->parseFile(pathIn,crc);
            std::string path = trailFolder(baseNamePathOut);
            result->dump(path);
            if (autoConv)
                autoDump(path,path,crc,recursive,autoConv);
            delete parser;
            delete result;
        }catch(std::runtime_error e){
            std::cout<<e.what();
        }
        return;
    default:
        //How
        return;
    }
    ParserResult *result;
    result = parser->parseFile(pathIn,crc);
    if (result == nullptr)
        throw CANT_PARSE(pathIn.c_str());
    if (getFileExtension(baseNamePathOut).empty())
        result->dump(baseNamePathOut+"."+fileExt);
    else
        result->dump(baseNamePathOut); //TODO: check given file-extension vs expected extension
    delete parser;
    delete result;
}